

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::PopulateTcParseFieldAux
          (Reflection *this,TailCallTableInfo *table_info,FieldAux *field_aux)

{
  DescriptorPool *this_00;
  MemoBase *pMVar1;
  bool bVar2;
  uint32_t uVar3;
  FieldAux FVar4;
  EnumDescriptor *this_01;
  pointer prVar5;
  EnumValueDescriptor *pEVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  size_type in_RCX;
  ReflectionSchema *this_02;
  pointer pAVar7;
  int i;
  int index;
  pointer pAVar8;
  Span<const_int> values;
  ReaderMutexLock lock;
  iterator it;
  MutexLock lock_1;
  pair<const_void_*,_const_void_*> key;
  byte local_a1;
  ReaderMutexLock local_a0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>::iterator,_bool>
  local_98;
  MutexLock local_80;
  pair<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>
  local_78;
  ReflectionSchema *local_58;
  pointer local_50;
  Reflection *local_48;
  key_arg<std::pair<const_void_*,_const_void_*>_> local_40;
  
  pAVar7 = (table_info->aux_entries).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar8 = (table_info->aux_entries).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = &this->schema_;
  local_58 = this_02;
  local_50 = pAVar8;
  local_48 = this;
  do {
    if (pAVar7 == pAVar8) {
      return;
    }
    switch(pAVar7->type) {
    case kNothing:
      field_aux->message_default_p = (void *)0x0;
      goto LAB_00c70dda;
    case kInlinedStringDonatedOffset:
      uVar3 = (this->schema_).inlined_string_donated_offset_;
      break;
    case kSplitOffset:
      uVar3 = internal::ReflectionSchema::SplitOffset(this_02);
      break;
    case kSplitSizeof:
      uVar3 = internal::ReflectionSchema::SizeofSplit(this_02);
      break;
    case kSubMessage:
      FVar4.table = (TcParseTableBase *)GetDefaultMessageInstance(this,(pAVar7->field_1).field);
      goto LAB_00c70dbf;
    case kSubTable:
    case kSubMessageWeak:
    case kMessageVerifyFunc:
    case kSelfVerifyFunc:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xdfa);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_98,(char (*) [14])"Not supported");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    case kEnumRange:
      FVar4 = *(FieldAux *)&pAVar7->field_1;
LAB_00c70dbf:
      *field_aux = FVar4;
      goto LAB_00c70dda;
    case kEnumValidator:
      this_01 = FieldDescriptor::enum_type((pAVar7->field_1).field);
      this_00 = this_01->file_->pool_;
      local_40.second =
           &DescriptorPool::
            MemoizeProjection<google::protobuf::EnumDescriptor,google::protobuf::Reflection::PopulateTcParseFieldAux(google::protobuf::internal::TailCallTableInfo_const&,google::protobuf::internal::TcParseTableBase::FieldAux*)const::$_0>(google::protobuf::EnumDescriptor_const*,google::protobuf::Reflection::PopulateTcParseFieldAux(google::protobuf::internal::TailCallTableInfo_const&,google::protobuf::internal::TcParseTableBase::FieldAux*)const::$_0)
            ::type_key;
      local_a0.mu_ = &this_00->field_memo_table_mutex_;
      local_40.first = this_01;
      absl::lts_20250127::Mutex::ReaderLock(&this_00->field_memo_table_mutex_);
      local_98.first =
           absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
           ::find<std::pair<void_const*,void_const*>>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
                       *)(this_00->field_memo_table_)._M_t.
                         super___uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                         .
                         super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
                         ._M_head_impl,&local_40);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                  *)(this_00->field_memo_table_)._M_t.
                    super___uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                    .
                    super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
                    ._M_head_impl);
      local_78.first.first = (ctrl_t *)0x0;
      bVar2 = absl::lts_20250127::container_internal::operator!=
                        (&local_98.first,(iterator *)&local_78);
      if (bVar2) {
        prVar5 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                 ::iterator::operator->(&local_98.first);
        pMVar1 = (prVar5->second)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>.
                 _M_head_impl;
        internal::
        AssertDownCast<google::protobuf::DescriptorPool::MemoData<std::vector<unsigned_int,std::allocator<unsigned_int>>>const,google::protobuf::DescriptorPool::MemoBase>
                  (pMVar1);
        this = (Reflection *)(pMVar1 + 1);
      }
      absl::lts_20250127::ReaderMutexLock::~ReaderMutexLock(&local_a0);
      if (!bVar2) {
        std::
        make_unique<google::protobuf::DescriptorPool::MemoData<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ();
        local_98.first = (iterator)ZEXT816(0);
        local_98.second = false;
        local_98._17_7_ = 0;
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)&local_98,(long)this_01->value_count_);
        for (index = 0; index < this_01->value_count_; index = index + 1) {
          pEVar6 = EnumDescriptor::value(this_01,index);
          local_80.mu_._0_4_ = pEVar6->number_;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&local_98,(int *)&local_80);
        }
        absl::lts_20250127::c_sort<std::vector<int,std::allocator<int>>>
                  ((vector<int,_std::allocator<int>_> *)&local_98);
        __first = std::
                  __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                            (local_98.first.ctrl_,local_98.first.field_1.slot_);
        std::vector<int,_std::allocator<int>_>::erase
                  ((vector<int,_std::allocator<int>_> *)&local_98,(const_iterator)__first._M_current
                   ,(const_iterator)local_98.first.field_1);
        values.ptr_ = (pointer)((long)local_98.first.field_1.slot_ - (long)local_98.first.ctrl_ >> 2
                               );
        values.len_ = in_RCX;
        internal::GenerateEnumData
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                   (internal *)local_98.first.ctrl_,values);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_98);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_a0.mu_ + 1),
                   &local_78);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
        local_80.mu_ = &this_00->field_memo_table_mutex_;
        absl::lts_20250127::Mutex::Lock(&this_00->field_memo_table_mutex_);
        local_78.second._M_t.
        super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
        .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>,_true,_true>
              )(__uniq_ptr_data<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>,_true,_true>
                )local_a0.mu_;
        local_78.first.first = local_40.first;
        local_78.first.second = local_40.second;
        local_a0.mu_ = (Mutex *)0x0;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
        ::
        emplace<std::pair<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_0>
                  (&local_98,
                   (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                    *)(this_00->field_memo_table_)._M_t.
                      super___uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                      .
                      super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
                      ._M_head_impl,&local_78);
        if (local_78.second._M_t.
            super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
            .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>._M_head_impl
            != (__uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                )0x0) {
          (**(code **)((long)*(atomic<long> *)
                              local_78.second._M_t.
                              super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                              .
                              super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>
                              ._M_head_impl + 8))();
        }
        local_78.first.first = local_98.first.ctrl_;
        local_78.first.second = (void *)local_98.first.field_1;
        prVar5 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
                 ::iterator::operator->((iterator *)&local_78);
        pMVar1 = (prVar5->second)._M_t.
                 super___uniq_ptr_impl<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>
                 .super__Head_base<0UL,_google::protobuf::DescriptorPool::MemoBase_*,_false>.
                 _M_head_impl;
        internal::
        AssertDownCast<google::protobuf::DescriptorPool::MemoData<std::vector<unsigned_int,std::allocator<unsigned_int>>>const,google::protobuf::DescriptorPool::MemoBase>
                  (pMVar1);
        absl::lts_20250127::MutexLock::~MutexLock(&local_80);
        if ((DescriptorPool *)local_a0.mu_ != (DescriptorPool *)0x0) {
          (**(code **)((((Mutex *)&(local_a0.mu_)->mu_)->mu_).super___atomic_base<long>._M_i + 8))()
          ;
        }
        this = (Reflection *)(pMVar1 + 1);
      }
      field_aux->enum_range = (anon_struct_8_2_e5911a21_for_enum_range)this->descriptor_;
      field_aux = field_aux + 1;
      this_02 = local_58;
      this = local_48;
      pAVar8 = local_50;
      goto switchD_00c70d9b_default;
    case kNumericOffset:
      uVar3 = (pAVar7->field_1).offset;
      break;
    case kMapAuxInfo:
      (field_aux->enum_range).first = 0;
      local_a1 = local_a1 & 0xe0;
      *(byte *)&(field_aux->enum_range).last = local_a1;
      field_aux = field_aux + 1;
    default:
      goto switchD_00c70d9b_default;
    }
    (field_aux->enum_range).first = uVar3;
LAB_00c70dda:
    field_aux = field_aux + 1;
switchD_00c70d9b_default:
    pAVar7 = pAVar7 + 1;
  } while( true );
}

Assistant:

void Reflection::PopulateTcParseFieldAux(
    const internal::TailCallTableInfo& table_info,
    TcParseTableBase::FieldAux* field_aux) const {
  for (const auto& aux_entry : table_info.aux_entries) {
    switch (aux_entry.type) {
      case internal::TailCallTableInfo::kNothing:
        *field_aux++ = {};
        break;
      case internal::TailCallTableInfo::kInlinedStringDonatedOffset:
        field_aux++->offset =
            static_cast<uint32_t>(schema_.inlined_string_donated_offset_);
        break;
      case internal::TailCallTableInfo::kSplitOffset:
        field_aux++->offset = schema_.SplitOffset();
        break;
      case internal::TailCallTableInfo::kSplitSizeof:
        field_aux++->offset = schema_.SizeofSplit();
        break;
      case internal::TailCallTableInfo::kSubTable:
      case internal::TailCallTableInfo::kSubMessageWeak:
      case internal::TailCallTableInfo::kMessageVerifyFunc:
      case internal::TailCallTableInfo::kSelfVerifyFunc:
        ABSL_LOG(FATAL) << "Not supported";
        break;
      case internal::TailCallTableInfo::kMapAuxInfo:
        // TODO: Fix this now that dynamic uses normal map ABIs.
        // Default constructed info, which causes MpMap to call the fallback.
        // DynamicMessage uses DynamicMapField, which uses variant keys and
        // values. TcParser does not support them yet, so mark the field as
        // unsupported to fallback to reflection.
        field_aux++->map_info = internal::MapAuxInfo{};
        break;
      case internal::TailCallTableInfo::kSubMessage:
        field_aux++->message_default_p =
            GetDefaultMessageInstance(aux_entry.field);
        break;
      case internal::TailCallTableInfo::kEnumRange:
        field_aux++->enum_range = {aux_entry.enum_range.first,
                                   aux_entry.enum_range.last};
        break;
      case internal::TailCallTableInfo::kEnumValidator:
        field_aux++->enum_data =
            DescriptorPool::MemoizeProjection(
                aux_entry.field->enum_type(),
                [](auto* e) { return MakeEnumValidatorData(e); })
                .data();
        break;
      case internal::TailCallTableInfo::kNumericOffset:
        field_aux++->offset = aux_entry.offset;
        break;
    }
  }
}